

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall kws::Parser::FindArea(Parser *this,char *name,size_t startPos)

{
  string *psVar1;
  bool bVar2;
  size_t pos;
  size_t sVar3;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar1,(ulong)name);
  while( true ) {
    if (pos == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar3 = strlen(name);
    if ((psVar1->_M_dataplus)._M_p[sVar3 + pos] == ':') break;
    FindNextWord_abi_cxx11_(&local_50,this,pos);
    bVar2 = std::operator==(&local_50,":");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      return pos;
    }
    pos = std::__cxx11::string::find((char *)psVar1,(ulong)name);
  }
  return pos;
}

Assistant:

size_t Parser::FindArea(const char* name,size_t startPos) const
{
  size_t pos = m_BufferNoComment.find(name, startPos);
  while(pos != std::string::npos)
    {
    if(m_BufferNoComment[pos+strlen(name)]==':' || this->FindNextWord(pos) == ":")
      {
      return pos;
      }
    pos = m_BufferNoComment.find(name, pos+1);
    }
  return std::string::npos;
}